

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_case_expression.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,CaseExpression *expr,
          idx_t depth)

{
  LogicalType *__return_storage_ptr___00;
  pointer pCVar1;
  ClientContext *pCVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  type pPVar7;
  type pEVar8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar9;
  BoundCaseExpression *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar10;
  pointer pBVar11;
  BinderException *this_01;
  pointer pCVar12;
  templated_unique_single_t result;
  LogicalType then_type;
  LogicalType return_type;
  ErrorData error;
  _Head_base<0UL,_duckdb::BoundCaseExpression_*,_false> local_210;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_208;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_200;
  undefined1 local_1f8 [64];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b0;
  undefined1 local_1a8 [16];
  LogicalType local_198;
  undefined8 local_180;
  optional_idx local_178;
  undefined1 local_170 [128];
  string local_f0;
  string local_d0;
  undefined1 local_b0 [128];
  
  local_1a8._8_8_ = __return_storage_ptr__;
  ErrorData::ErrorData((ErrorData *)local_170);
  pCVar12 = (expr->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
            super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (expr->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
           super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar12 != pCVar1) {
    do {
      BindChild(this,&pCVar12->when_expr,depth,(ErrorData *)local_170);
      BindChild(this,&pCVar12->then_expr,depth,(ErrorData *)local_170);
      pCVar12 = pCVar12 + 1;
    } while (pCVar12 != pCVar1);
  }
  BindChild(this,&expr->else_expr,depth,(ErrorData *)local_170);
  if (local_170[0] == true) {
    local_b0._0_2_ = local_170._0_2_;
    if ((undefined1 *)local_170._8_8_ == local_170 + 0x18) {
      local_b0._32_4_ = local_170._32_4_;
      local_b0._36_4_ = local_170._36_4_;
      local_b0._8_8_ = local_b0 + 0x18;
    }
    else {
      local_b0._8_8_ = local_170._8_8_;
    }
    local_b0._16_8_ = local_170._16_8_;
    local_170._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_170._24_4_ = local_170._24_4_ & 0xffffff00;
    if ((undefined1 *)local_170._40_8_ == local_170 + 0x38) {
      local_b0._64_4_ = local_170._64_4_;
      local_b0._68_4_ = local_170._68_4_;
      local_b0._40_8_ = local_b0 + 0x38;
    }
    else {
      local_b0._40_8_ = local_170._40_8_;
    }
    local_b0._48_8_ = local_170._48_8_;
    local_170._48_8_ = (cast_function_t)0x0;
    local_170._56_4_ = local_170._56_4_ & 0xffffff00;
    local_170._8_8_ = local_170 + 0x18;
    local_170._40_8_ = local_170 + 0x38;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_b0 + 0x48),local_170 + 0x48);
    BindResult::BindResult((BindResult *)local_1a8._8_8_,(ErrorData *)local_b0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
      operator_delete((void *)local_b0._8_8_);
    }
  }
  else {
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(&expr->else_expr);
    local_180 = BoundExpression::GetExpression(pPVar7);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_180);
    GetExpressionReturnType(&local_198,pEVar8);
    pCVar12 = (expr->case_checks).
              super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
              super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar1 = (expr->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>
             .super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar12 != pCVar1) {
      __return_storage_ptr___00 = (LogicalType *)(local_1f8 + 0x20);
      do {
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(&pCVar12->then_expr);
        puVar9 = BoundExpression::GetExpression(pPVar7);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(puVar9);
        GetExpressionReturnType(__return_storage_ptr___00,pEVar8);
        bVar6 = LogicalType::TryGetMaxLogicalType
                          (this->context,&local_198,__return_storage_ptr___00,&local_198);
        if (!bVar6) {
          this_01 = (BinderException *)__cxa_allocate_exception(0x10);
          local_1f8._0_8_ = local_1f8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,
                     "Cannot mix values of type %s and %s in CASE expression - an explicit cast is required"
                     ,"");
          LogicalType::ToString_abi_cxx11_(&local_d0,&local_198);
          LogicalType::ToString_abi_cxx11_(&local_f0,(LogicalType *)(local_1f8 + 0x20));
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (this_01,&expr->super_ParsedExpression,(string *)local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0)
          ;
          __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::~LogicalType(__return_storage_ptr___00);
        pCVar12 = pCVar12 + 1;
      } while (pCVar12 != pCVar1);
    }
    this_00 = (BoundCaseExpression *)operator_new(0x78);
    LogicalType::LogicalType((LogicalType *)local_1f8,&local_198);
    BoundCaseExpression::BoundCaseExpression(this_00,(LogicalType *)local_1f8);
    local_210._M_head_impl = this_00;
    LogicalType::~LogicalType((LogicalType *)local_1f8);
    pCVar12 = (expr->case_checks).
              super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
              super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_178.index =
         (idx_t)(expr->case_checks).
                super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (pCVar12 != (pointer)local_178.index) {
      do {
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(&pCVar12->when_expr);
        puVar9 = BoundExpression::GetExpression(pPVar7);
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(&pCVar12->then_expr);
        puVar10 = BoundExpression::GetExpression(pPVar7);
        local_1f8._32_8_ = (long *)0x0;
        local_1f8._40_8_ = (long *)0x0;
        pCVar2 = this->context;
        local_200._M_head_impl =
             (puVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        LogicalType::LogicalType((LogicalType *)local_1f8,BOOLEAN);
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_1a8,pCVar2,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_200,(LogicalType *)local_1f8,false);
        uVar5 = local_1a8._0_8_;
        uVar4 = local_1f8._32_8_;
        local_1a8._0_8_ = (BaseStatistics *)0x0;
        local_1f8._32_8_ = uVar5;
        if ((long *)uVar4 != (long *)0x0) {
          (**(code **)(*(long *)uVar4 + 8))();
        }
        if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
             )local_1a8._0_8_ != (BaseStatistics *)0x0) {
          (**(code **)(*(long *)local_1a8._0_8_ + 8))();
        }
        local_1a8._0_8_ =
             (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
              )0x0;
        LogicalType::~LogicalType((LogicalType *)local_1f8);
        if (local_200._M_head_impl != (Expression *)0x0) {
          (*((local_200._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_200._M_head_impl = (Expression *)0x0;
        pCVar2 = this->context;
        local_208._M_head_impl =
             (puVar10->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_1f8,pCVar2,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_208,&local_198,false);
        uVar4 = local_1f8._40_8_;
        local_1f8._40_8_ = local_1f8._0_8_;
        local_1f8._0_8_ = (_func_int **)0x0;
        if ((long *)uVar4 != (long *)0x0) {
          (**(code **)(*(long *)uVar4 + 8))();
        }
        if ((_func_int **)local_1f8._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_1f8._0_8_ + 8))();
        }
        local_1f8._0_8_ = (Expression *)0x0;
        if (local_208._M_head_impl != (Expression *)0x0) {
          (*((local_208._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_208._M_head_impl = (Expression *)0x0;
        pBVar11 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                                *)&local_210);
        ::std::vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>::
        emplace_back<duckdb::BoundCaseCheck>
                  (&(pBVar11->case_checks).
                    super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>,
                   (BoundCaseCheck *)(local_1f8 + 0x20));
        if ((Expression *)local_1f8._40_8_ != (Expression *)0x0) {
          (**(code **)(*(long *)local_1f8._40_8_ + 8))();
        }
        local_1f8._40_8_ = 0;
        if ((long *)local_1f8._32_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_1f8._32_8_ + 8))();
        }
        pCVar12 = pCVar12 + 1;
      } while (pCVar12 != (pointer)local_178.index);
    }
    pCVar2 = this->context;
    local_1b0._M_head_impl = *(Expression **)local_180;
    *(__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true> *)
     local_180 = (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                  )0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)local_1f8,pCVar2,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1b0,&local_198,false);
    pBVar11 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                            *)&local_210);
    uVar4 = local_1f8._0_8_;
    local_1f8._0_8_ = (_func_int **)0x0;
    _Var3._M_head_impl =
         (pBVar11->else_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar11->else_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar4;
    if (_Var3._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((_func_int **)local_1f8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_1f8._0_8_ + 8))();
    }
    local_1f8._0_8_ = (Expression *)0x0;
    if (local_1b0._M_head_impl != (Expression *)0x0) {
      (*((local_1b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_1b8._M_head_impl = &(local_210._M_head_impl)->super_Expression;
    local_1b0._M_head_impl = (Expression *)0x0;
    local_210._M_head_impl = (BoundCaseExpression *)0x0;
    BindResult::BindResult
              ((BindResult *)local_1a8._8_8_,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1b8);
    if ((BoundCaseExpression *)local_1b8._M_head_impl != (BoundCaseExpression *)0x0) {
      (*(((Expression *)&(local_1b8._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_1b8._M_head_impl = (Expression *)0x0;
    if (local_210._M_head_impl != (BoundCaseExpression *)0x0) {
      (*((local_210._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    LogicalType::~LogicalType(&local_198);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_170 + 0x48));
  if ((undefined1 *)local_170._40_8_ != local_170 + 0x38) {
    operator_delete((void *)local_170._40_8_);
  }
  if ((undefined1 *)local_170._8_8_ != local_170 + 0x18) {
    operator_delete((void *)local_170._8_8_);
  }
  return (BindResult *)(_Head_base<0UL,_duckdb::Expression_*,_false>)local_1a8._8_8_;
}

Assistant:

BindResult ExpressionBinder::BindExpression(CaseExpression &expr, idx_t depth) {
	// first try to bind the children of the case expression
	ErrorData error;
	for (auto &check : expr.case_checks) {
		BindChild(check.when_expr, depth, error);
		BindChild(check.then_expr, depth, error);
	}
	BindChild(expr.else_expr, depth, error);
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	// the children have been successfully resolved
	// figure out the result type of the CASE expression
	auto &else_expr = BoundExpression::GetExpression(*expr.else_expr);
	auto return_type = ExpressionBinder::GetExpressionReturnType(*else_expr);
	for (auto &check : expr.case_checks) {
		auto &then_expr = BoundExpression::GetExpression(*check.then_expr);
		auto then_type = ExpressionBinder::GetExpressionReturnType(*then_expr);
		if (!LogicalType::TryGetMaxLogicalType(context, return_type, then_type, return_type)) {
			throw BinderException(
			    expr, "Cannot mix values of type %s and %s in CASE expression - an explicit cast is required",
			    return_type.ToString(), then_type.ToString());
		}
	}

	// bind all the individual components of the CASE statement
	auto result = make_uniq<BoundCaseExpression>(return_type);
	for (auto &check : expr.case_checks) {
		auto &when_expr = BoundExpression::GetExpression(*check.when_expr);
		auto &then_expr = BoundExpression::GetExpression(*check.then_expr);
		BoundCaseCheck result_check;
		result_check.when_expr =
		    BoundCastExpression::AddCastToType(context, std::move(when_expr), LogicalType::BOOLEAN);
		result_check.then_expr = BoundCastExpression::AddCastToType(context, std::move(then_expr), return_type);
		result->case_checks.push_back(std::move(result_check));
	}
	result->else_expr = BoundCastExpression::AddCastToType(context, std::move(else_expr), return_type);
	return BindResult(std::move(result));
}